

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,initializer_list<long> l,string *name_in)

{
  void *__buf;
  Write<int> local_30;
  Write<long> local_20;
  
  HostWrite<long>::HostWrite((HostWrite<long> *)&local_20,l,name_in);
  HostWrite<long>::write((HostWrite<long> *)&local_30,(int)&local_20,__buf,(size_t)name_in);
  Write<long>::Write((Write<int> *)this,&local_30);
  Write<long>::~Write((Write<long> *)&local_30);
  Write<long>::~Write(&local_20);
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}